

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH64_hash_t XXH64_digest(XXH64_state_t *state)

{
  xxh_u64 xVar1;
  ulong *in_RDI;
  xxh_u64 unaff_retaddr;
  xxh_u64 h64;
  undefined4 in_stack_ffffffffffffffe8;
  XXH_alignment in_stack_ffffffffffffffec;
  
  if (*in_RDI < 0x20) {
    xVar1 = in_RDI[3] + 0x27d4eb2f165667c5;
  }
  else {
    xVar1 = XXH64_mergeRound((in_RDI[1] << 1 | (ulong)((long)in_RDI[1] < 0)) +
                             (in_RDI[2] << 7 | in_RDI[2] >> 0x39) +
                             (in_RDI[3] << 0xc | in_RDI[3] >> 0x34) +
                             (in_RDI[4] << 0x12 | in_RDI[4] >> 0x2e),
                             CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    xVar1 = XXH64_mergeRound(xVar1,CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    xVar1 = XXH64_mergeRound(xVar1,CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    xVar1 = XXH64_mergeRound(xVar1,CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  }
  xVar1 = XXH64_finalize(unaff_retaddr,(xxh_u8 *)in_RDI,*in_RDI + xVar1,in_stack_ffffffffffffffec);
  return xVar1;
}

Assistant:

XXH_PUBLIC_API XXH64_hash_t XXH64_digest(XXH_NOESCAPE const XXH64_state_t* state)
{
    xxh_u64 h64;

    if (state->total_len >= 32) {
        h64 = XXH_rotl64(state->v[0], 1) + XXH_rotl64(state->v[1], 7) + XXH_rotl64(state->v[2], 12) + XXH_rotl64(state->v[3], 18);
        h64 = XXH64_mergeRound(h64, state->v[0]);
        h64 = XXH64_mergeRound(h64, state->v[1]);
        h64 = XXH64_mergeRound(h64, state->v[2]);
        h64 = XXH64_mergeRound(h64, state->v[3]);
    } else {
        h64  = state->v[2] /*seed*/ + XXH_PRIME64_5;
    }

    h64 += (xxh_u64) state->total_len;

    return XXH64_finalize(h64, (const xxh_u8*)state->mem64, (size_t)state->total_len, XXH_aligned);
}